

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteKLut(FILE *pFile,int nLutSize)

{
  uint uVar1;
  char *__format;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = 1 << ((byte)nLutSize & 0x1f);
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".model lut%d\n",nLutSize);
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (nLutSize != 0x1f) {
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = uVar2;
    }
    uVar7 = 0;
    do {
      fprintf((FILE *)pFile," p%02d",uVar7);
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar5 != uVar4);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (0 < nLutSize) {
    uVar7 = 0;
    do {
      fprintf((FILE *)pFile," i%d",uVar7);
      uVar5 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar5;
    } while (nLutSize != uVar5);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs o\n",0xb,1,(FILE *)pFile);
  fwrite(".names n01 o\n",0xd,1,(FILE *)pFile);
  fwrite("1 1\n",4,1,(FILE *)pFile);
  if (1 < (int)uVar2) {
    uVar3 = 1;
    iVar6 = 2;
    uVar5 = 2;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (uVar3 == uVar5);
      uVar5 = uVar5 << (uVar3 == uVar5);
      bVar8 = uVar4 == nLutSize - 1U;
      uVar1 = 0;
      if (bVar8) {
        uVar1 = uVar2 >> 1;
      }
      __format = ".names i%d n%02d n%02d n%02d\n";
      if (bVar8) {
        __format = ".names i%d p%02d p%02d n%02d\n";
      }
      fprintf((FILE *)pFile,__format,(ulong)uVar4,(ulong)(iVar6 + uVar1 * -2),
              (ulong)(iVar6 + uVar1 * -2 + 1),(ulong)uVar3);
      fwrite("01- 1\n",6,1,(FILE *)pFile);
      fwrite("1-1 1\n",6,1,(FILE *)pFile);
      uVar3 = uVar3 + 1;
      iVar6 = iVar6 + 2;
    } while (uVar2 != uVar3);
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteKLut( FILE * pFile, int nLutSize )
{
    int i, iVar, iNext, nPars = (1 << nLutSize);
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".model lut%d\n", nLutSize );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nPars; i++ )
        fprintf( pFile, " p%02d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nLutSize; i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" ); 
    fprintf( pFile, ".names n01 o\n" ); 
    fprintf( pFile, "1 1\n" ); 
    // write internal MUXes
    iVar = 0;
    iNext = 2;
    for ( i = 1; i < nPars; i++ )
    {
        if ( i == iNext )
        {
            iNext *= 2;
            iVar++; 
        }
        if ( iVar == nLutSize - 1 )
            fprintf( pFile, ".names i%d p%02d p%02d n%02d\n", iVar, 2*(i-nPars/2), 2*(i-nPars/2)+1, i ); 
        else
            fprintf( pFile, ".names i%d n%02d n%02d n%02d\n", iVar, 2*i, 2*i+1, i ); 
        fprintf( pFile, "01- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}